

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::InstanceArrayIntersectorK<4>_>,_false>
     ::intersectCoherent(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,
                        RayQueryContext *context)

{
  StackItemT<embree::NodeRefPtr<4>_> *pSVar1;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar2;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar3;
  float *pfVar4;
  AccelData *pAVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  size_t sVar10;
  undefined8 uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  undefined4 uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  NodeRef nodeRef;
  Primitive_conflict4 *prim;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  vint4 bi;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  vint4 bi_1;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  vint4 ai_3;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  vint4 bi_2;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [64];
  vint4 bi_3;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  vint4 bi_5;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  vint4 ai_2;
  undefined1 auVar62 [16];
  vint4 bi_4;
  undefined1 auVar63 [16];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  Precalculations pre;
  vbool<4> valid_leaf;
  vint4 bi_10;
  undefined1 local_10f8 [16];
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [8];
  float fStack_1050;
  float fStack_104c;
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [8];
  float fStack_1020;
  float fStack_101c;
  undefined1 local_1018 [16];
  undefined1 local_1008 [8];
  float fStack_1000;
  float fStack_ffc;
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [8];
  float fStack_fe0;
  float fStack_fdc;
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [8];
  float fStack_fc0;
  float fStack_fbc;
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [8];
  float fStack_fa0;
  float fStack_f9c;
  undefined1 local_f98 [16];
  vfloat<4> fmin;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  auVar26 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  auVar27 = vpcmpeqd_avx(auVar26,(undefined1  [16])valid_i->field_0);
  uVar12 = vmovmskps_avx(auVar27);
  if (uVar12 == 0) {
    return;
  }
  pAVar5 = This->ptr;
  uVar18 = (ulong)(uVar12 & 0xff);
  auVar65 = ZEXT1664(*(undefined1 (*) [16])ray);
  auVar66 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x10));
  auVar67 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x20));
  auVar53 = *(undefined1 (*) [16])(ray + 0x40);
  auVar38._8_4_ = 0x7fffffff;
  auVar38._0_8_ = 0x7fffffff7fffffff;
  auVar38._12_4_ = 0x7fffffff;
  auVar29 = vandps_avx(auVar53,auVar38);
  auVar51._8_4_ = 0x219392ef;
  auVar51._0_8_ = 0x219392ef219392ef;
  auVar51._12_4_ = 0x219392ef;
  auVar29 = vcmpps_avx(auVar29,auVar51,1);
  auVar40 = vblendvps_avx(auVar53,auVar51,auVar29);
  auVar29 = *(undefined1 (*) [16])(ray + 0x50);
  auVar31 = vandps_avx(auVar29,auVar38);
  auVar31 = vcmpps_avx(auVar31,auVar51,1);
  auVar39 = vblendvps_avx(auVar29,auVar51,auVar31);
  auVar31 = *(undefined1 (*) [16])(ray + 0x60);
  auVar38 = vandps_avx(auVar31,auVar38);
  auVar38 = vcmpps_avx(auVar38,auVar51,1);
  auVar38 = vblendvps_avx(auVar31,auVar51,auVar38);
  auVar46 = vrcpps_avx(auVar40);
  fVar6 = auVar46._0_4_;
  auVar45._0_4_ = auVar40._0_4_ * fVar6;
  fVar7 = auVar46._4_4_;
  auVar45._4_4_ = auVar40._4_4_ * fVar7;
  fVar8 = auVar46._8_4_;
  auVar45._8_4_ = auVar40._8_4_ * fVar8;
  fVar9 = auVar46._12_4_;
  auVar45._12_4_ = auVar40._12_4_ * fVar9;
  auVar63._8_4_ = 0x3f800000;
  auVar63._0_8_ = 0x3f8000003f800000;
  auVar63._12_4_ = 0x3f800000;
  auVar40 = vsubps_avx(auVar63,auVar45);
  local_10a8._0_4_ = fVar6 + fVar6 * auVar40._0_4_;
  local_10a8._4_4_ = fVar7 + fVar7 * auVar40._4_4_;
  local_10a8._8_4_ = fVar8 + fVar8 * auVar40._8_4_;
  local_10a8._12_4_ = fVar9 + fVar9 * auVar40._12_4_;
  auVar68 = ZEXT1664(local_10a8);
  auVar40 = vrcpps_avx(auVar39);
  fVar6 = auVar40._0_4_;
  auVar52._0_4_ = auVar39._0_4_ * fVar6;
  fVar7 = auVar40._4_4_;
  auVar52._4_4_ = auVar39._4_4_ * fVar7;
  fVar8 = auVar40._8_4_;
  auVar52._8_4_ = auVar39._8_4_ * fVar8;
  fVar9 = auVar40._12_4_;
  auVar52._12_4_ = auVar39._12_4_ * fVar9;
  auVar40 = vsubps_avx(auVar63,auVar52);
  local_10b8._0_4_ = fVar6 + fVar6 * auVar40._0_4_;
  local_10b8._4_4_ = fVar7 + fVar7 * auVar40._4_4_;
  local_10b8._8_4_ = fVar8 + fVar8 * auVar40._8_4_;
  local_10b8._12_4_ = fVar9 + fVar9 * auVar40._12_4_;
  auVar69 = ZEXT1664(local_10b8);
  auVar40 = vrcpps_avx(auVar38);
  fVar6 = auVar40._0_4_;
  auVar39._0_4_ = auVar38._0_4_ * fVar6;
  fVar7 = auVar40._4_4_;
  auVar39._4_4_ = auVar38._4_4_ * fVar7;
  fVar8 = auVar40._8_4_;
  auVar39._8_4_ = auVar38._8_4_ * fVar8;
  fVar9 = auVar40._12_4_;
  auVar39._12_4_ = auVar38._12_4_ * fVar9;
  auVar38 = vsubps_avx(auVar63,auVar39);
  local_10c8._0_4_ = fVar6 + fVar6 * auVar38._0_4_;
  local_10c8._4_4_ = fVar7 + fVar7 * auVar38._4_4_;
  local_10c8._8_4_ = fVar8 + fVar8 * auVar38._8_4_;
  local_10c8._12_4_ = fVar9 + fVar9 * auVar38._12_4_;
  auVar64 = ZEXT1664(local_10c8);
  auVar38 = ZEXT416(0) << 0x20;
  local_10d8 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar38);
  local_10e8 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar38);
  auVar53 = vcmpps_avx(auVar53,auVar38,1);
  auVar40._8_4_ = 1;
  auVar40._0_8_ = 0x100000001;
  auVar40._12_4_ = 1;
  auVar53 = vandps_avx(auVar53,auVar40);
  auVar29 = vcmpps_avx(auVar29,auVar38,1);
  auVar46._8_4_ = 2;
  auVar46._0_8_ = 0x200000002;
  auVar46._12_4_ = 2;
  auVar29 = vandps_avx(auVar29,auVar46);
  auVar29 = vorps_avx(auVar29,auVar53);
  auVar53 = vcmpps_avx(auVar31,auVar38,1);
  auVar31._8_4_ = 4;
  auVar31._0_8_ = 0x400000004;
  auVar31._12_4_ = 4;
  auVar53 = vandps_avx(auVar53,auVar31);
  auVar26 = vpor_avx(auVar27 ^ auVar26,auVar53);
  local_10f8 = vpor_avx(auVar26,auVar29);
  local_1078 = *(undefined1 (*) [16])ray;
  local_1088 = *(undefined1 (*) [16])(ray + 0x10);
  local_1098 = *(undefined1 (*) [16])(ray + 0x20);
LAB_00f1ae7b:
  lVar16 = 0;
  if (uVar18 != 0) {
    for (; (uVar18 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
    }
  }
  uVar17 = *(undefined4 *)(local_10f8 + lVar16 * 4);
  auVar26._4_4_ = uVar17;
  auVar26._0_4_ = uVar17;
  auVar26._8_4_ = uVar17;
  auVar26._12_4_ = uVar17;
  auVar31 = vpcmpeqd_avx(auVar26,local_10f8);
  uVar17 = vmovmskps_avx(auVar31);
  uVar18 = ~CONCAT44((int)((ulong)lVar16 >> 0x20),uVar17) & uVar18;
  auVar59._8_4_ = 0x7f800000;
  auVar59._0_8_ = 0x7f8000007f800000;
  auVar59._12_4_ = 0x7f800000;
  auVar26 = vblendvps_avx(auVar59,auVar65._0_16_,auVar31);
  auVar27 = vshufps_avx(auVar26,auVar26,0xb1);
  auVar26 = vminps_avx(auVar27,auVar26);
  auVar27 = vshufpd_avx(auVar26,auVar26,1);
  auVar27 = vminps_avx(auVar27,auVar26);
  auVar26 = vblendvps_avx(auVar59,auVar66._0_16_,auVar31);
  auVar53 = vshufps_avx(auVar26,auVar26,0xb1);
  auVar26 = vminps_avx(auVar53,auVar26);
  auVar53 = vshufpd_avx(auVar26,auVar26,1);
  auVar53 = vminps_avx(auVar53,auVar26);
  auVar26 = vblendvps_avx(auVar59,auVar67._0_16_,auVar31);
  auVar27 = vinsertps_avx(auVar27,auVar53,0x1c);
  auVar53 = vshufps_avx(auVar26,auVar26,0xb1);
  auVar26 = vminps_avx(auVar53,auVar26);
  auVar53 = vshufpd_avx(auVar26,auVar26,1);
  auVar26 = vminps_avx(auVar53,auVar26);
  auVar29 = vinsertps_avx(auVar27,auVar26,0x20);
  auVar62._8_4_ = 0xff800000;
  auVar62._0_8_ = 0xff800000ff800000;
  auVar62._12_4_ = 0xff800000;
  auVar26 = vblendvps_avx(auVar62,auVar65._0_16_,auVar31);
  auVar27 = vshufps_avx(auVar26,auVar26,0xb1);
  auVar26 = vmaxps_avx(auVar27,auVar26);
  auVar27 = vshufpd_avx(auVar26,auVar26,1);
  auVar27 = vmaxps_avx(auVar27,auVar26);
  auVar26 = vblendvps_avx(auVar62,auVar66._0_16_,auVar31);
  auVar53 = vshufps_avx(auVar26,auVar26,0xb1);
  auVar26 = vmaxps_avx(auVar53,auVar26);
  auVar53 = vshufpd_avx(auVar26,auVar26,1);
  auVar53 = vmaxps_avx(auVar53,auVar26);
  auVar26 = vblendvps_avx(auVar62,auVar67._0_16_,auVar31);
  auVar27 = vinsertps_avx(auVar27,auVar53,0x1c);
  auVar53 = vshufps_avx(auVar26,auVar26,0xb1);
  auVar26 = vmaxps_avx(auVar53,auVar26);
  auVar53 = vshufpd_avx(auVar26,auVar26,1);
  auVar26 = vmaxps_avx(auVar53,auVar26);
  auVar38 = vinsertps_avx(auVar27,auVar26,0x20);
  auVar26 = vblendvps_avx(auVar59,auVar68._0_16_,auVar31);
  auVar27 = vshufps_avx(auVar26,auVar26,0xb1);
  auVar26 = vminps_avx(auVar27,auVar26);
  auVar27 = vshufpd_avx(auVar26,auVar26,1);
  auVar27 = vminps_avx(auVar27,auVar26);
  auVar26 = vblendvps_avx(auVar59,auVar69._0_16_,auVar31);
  auVar53 = vshufps_avx(auVar26,auVar26,0xb1);
  auVar26 = vminps_avx(auVar53,auVar26);
  auVar53 = vshufpd_avx(auVar26,auVar26,1);
  auVar53 = vminps_avx(auVar53,auVar26);
  auVar26 = vblendvps_avx(auVar59,auVar64._0_16_,auVar31);
  auVar27 = vinsertps_avx(auVar27,auVar53,0x1c);
  auVar53 = vshufps_avx(auVar26,auVar26,0xb1);
  auVar26 = vminps_avx(auVar53,auVar26);
  auVar53 = vshufpd_avx(auVar26,auVar26,1);
  auVar26 = vminps_avx(auVar53,auVar26);
  auVar40 = vinsertps_avx(auVar27,auVar26,0x20);
  auVar26 = vblendvps_avx(auVar62,auVar68._0_16_,auVar31);
  auVar27 = vshufps_avx(auVar26,auVar26,0xb1);
  auVar26 = vmaxps_avx(auVar27,auVar26);
  auVar27 = vshufpd_avx(auVar26,auVar26,1);
  auVar27 = vmaxps_avx(auVar27,auVar26);
  auVar26 = vblendvps_avx(auVar62,auVar69._0_16_,auVar31);
  auVar53 = vshufps_avx(auVar26,auVar26,0xb1);
  auVar26 = vmaxps_avx(auVar53,auVar26);
  auVar53 = vshufpd_avx(auVar26,auVar26,1);
  auVar53 = vmaxps_avx(auVar53,auVar26);
  auVar26 = vblendvps_avx(auVar62,auVar64._0_16_,auVar31);
  auVar27 = vinsertps_avx(auVar27,auVar53,0x1c);
  auVar53 = vshufps_avx(auVar26,auVar26,0xb1);
  auVar26 = vmaxps_avx(auVar53,auVar26);
  auVar53 = vshufpd_avx(auVar26,auVar26,1);
  auVar26 = vmaxps_avx(auVar53,auVar26);
  auVar39 = vinsertps_avx(auVar27,auVar26,0x20);
  local_f98 = vblendvps_avx(auVar59,local_10d8,auVar31);
  auVar26 = vshufps_avx(local_f98,local_f98,0xb1);
  auVar46 = vminps_avx(auVar26,local_f98);
  auVar26 = vblendvps_avx(auVar62,local_10e8,auVar31);
  auVar56 = ZEXT1664(auVar26);
  auVar45 = vshufps_avx(auVar26,auVar26,0xb1);
  auVar31 = vcmpps_avx(auVar40,_DAT_01f45a50,5);
  auVar27 = vblendvps_avx(auVar39,auVar40,auVar31);
  auVar53 = vblendvps_avx(auVar29,auVar38,auVar31);
  auVar29 = vblendvps_avx(auVar38,auVar29,auVar31);
  auVar26 = vmaxps_avx(auVar45,auVar26);
  auVar38 = vmovshdup_avx(auVar27);
  uVar23 = (ulong)(auVar38._0_4_ < 0.0) << 4 | 0x20;
  auVar38 = vshufpd_avx(auVar27,auVar27,1);
  auVar45 = vshufpd_avx(auVar26,auVar26,1);
  uVar20 = (ulong)(auVar38._0_4_ < 0.0) << 4 | 0x40;
  auVar38 = vmaxss_avx(auVar45,auVar26);
  auVar26 = vblendvps_avx(auVar40,auVar39,auVar31);
  auVar47._0_4_ = auVar53._0_4_ * auVar27._0_4_;
  auVar47._4_4_ = auVar53._4_4_ * auVar27._4_4_;
  auVar47._8_4_ = auVar53._8_4_ * auVar27._8_4_;
  auVar47._12_4_ = auVar53._12_4_ * auVar27._12_4_;
  auVar32._0_4_ = auVar29._0_4_ * auVar26._0_4_;
  auVar32._4_4_ = auVar29._4_4_ * auVar26._4_4_;
  auVar32._8_4_ = auVar29._8_4_ * auVar26._8_4_;
  auVar32._12_4_ = auVar29._12_4_ * auVar26._12_4_;
  uVar22 = (ulong)(auVar27._0_4_ < 0.0) * 0x10;
  stack[0].ptr.ptr = *(size_t *)&pAVar5[1].bounds.bounds0.lower.field_0;
  stack[0].dist = 0;
  _local_fa8 = vshufps_avx(auVar27,auVar27,0);
  local_fb8 = vshufps_avx(auVar47,auVar47,0);
  _local_fc8 = vshufps_avx(auVar27,auVar27,0x55);
  local_fd8 = vshufps_avx(auVar47,auVar47,0x55);
  _local_fe8 = vshufps_avx(auVar27,auVar27,0xaa);
  local_ff8 = vshufps_avx(auVar47,auVar47,0xaa);
  _local_1008 = vshufps_avx(auVar26,auVar26,0);
  local_1018 = vshufps_avx(auVar32,auVar32,0);
  _local_1028 = vshufps_avx(auVar26,auVar26,0x55);
  auVar27 = vshufps_avx(auVar46,auVar46,0);
  auVar53 = vshufps_avx(auVar46,auVar46,0xaa);
  local_1038 = vminps_avx(auVar53,auVar27);
  auVar28 = ZEXT1664(auVar38);
  local_1048 = vshufps_avx(auVar32,auVar32,0x55);
  _local_1058 = vshufps_avx(auVar26,auVar26,0xaa);
  local_1068 = vshufps_avx(auVar32,auVar32,0xaa);
  pSVar24 = stack + 1;
  do {
    auVar27 = auVar28._0_16_;
    auVar26 = vshufps_avx(auVar27,auVar27,0);
    auVar53 = auVar56._0_16_;
LAB_00f1b1c9:
    do {
      if (pSVar24 == stack) {
        if (uVar18 == 0) {
          return;
        }
        goto LAB_00f1ae7b;
      }
      uVar12 = pSVar24[-1].dist;
      auVar29._4_4_ = uVar12;
      auVar29._0_4_ = uVar12;
      auVar29._8_4_ = uVar12;
      auVar29._12_4_ = uVar12;
      auVar28 = ZEXT1664(auVar29);
      pSVar24 = pSVar24 + -1;
      auVar29 = vcmpps_avx(auVar29,auVar56._0_16_,1);
    } while ((((auVar29 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
              (auVar29 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar29 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             -1 < auVar29[0xf]);
    uVar13 = (pSVar24->ptr).ptr;
LAB_00f1b1f3:
    if ((uVar13 & 8) == 0) {
      pfVar4 = (float *)(uVar13 + 0x20 + uVar22);
      auVar30._0_4_ = (float)local_fa8._0_4_ * *pfVar4;
      auVar30._4_4_ = (float)local_fa8._4_4_ * pfVar4[1];
      auVar30._8_4_ = fStack_fa0 * pfVar4[2];
      auVar30._12_4_ = fStack_f9c * pfVar4[3];
      pfVar4 = (float *)(uVar13 + 0x20 + uVar23);
      auVar33._0_4_ = (float)local_fc8._0_4_ * *pfVar4;
      auVar33._4_4_ = (float)local_fc8._4_4_ * pfVar4[1];
      auVar33._8_4_ = fStack_fc0 * pfVar4[2];
      auVar33._12_4_ = fStack_fbc * pfVar4[3];
      auVar29 = vsubps_avx(auVar30,local_fb8);
      auVar31 = vsubps_avx(auVar33,local_fd8);
      pfVar4 = (float *)(uVar13 + 0x20 + uVar20);
      auVar41._0_4_ = (float)local_fe8._0_4_ * *pfVar4;
      auVar41._4_4_ = (float)local_fe8._4_4_ * pfVar4[1];
      auVar41._8_4_ = fStack_fe0 * pfVar4[2];
      auVar41._12_4_ = fStack_fdc * pfVar4[3];
      auVar29 = vpmaxsd_avx(auVar29,auVar31);
      auVar31 = vsubps_avx(auVar41,local_ff8);
      auVar31 = vpmaxsd_avx(auVar31,local_1038);
      fmin.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vpmaxsd_avx(auVar29,auVar31);
      pfVar4 = (float *)(uVar13 + 0x20 + (uVar22 ^ 0x10));
      auVar34._0_4_ = (float)local_1008._0_4_ * *pfVar4;
      auVar34._4_4_ = (float)local_1008._4_4_ * pfVar4[1];
      auVar34._8_4_ = fStack_1000 * pfVar4[2];
      auVar34._12_4_ = fStack_ffc * pfVar4[3];
      pfVar4 = (float *)(uVar13 + 0x20 + (uVar23 ^ 0x10));
      auVar42._0_4_ = (float)local_1028._0_4_ * *pfVar4;
      auVar42._4_4_ = (float)local_1028._4_4_ * pfVar4[1];
      auVar42._8_4_ = fStack_1020 * pfVar4[2];
      auVar42._12_4_ = fStack_101c * pfVar4[3];
      auVar29 = vsubps_avx(auVar34,local_1018);
      auVar31 = vsubps_avx(auVar42,local_1048);
      pfVar4 = (float *)(uVar13 + 0x20 + (uVar20 ^ 0x10));
      auVar48._0_4_ = (float)local_1058._0_4_ * *pfVar4;
      auVar48._4_4_ = (float)local_1058._4_4_ * pfVar4[1];
      auVar48._8_4_ = fStack_1050 * pfVar4[2];
      auVar48._12_4_ = fStack_104c * pfVar4[3];
      auVar29 = vpminsd_avx(auVar29,auVar31);
      auVar31 = vsubps_avx(auVar48,local_1068);
      auVar31 = vpminsd_avx(auVar31,auVar26);
      auVar29 = vpminsd_avx(auVar29,auVar31);
      auVar29 = vcmpps_avx((undefined1  [16])fmin.field_0,auVar29,2);
      uVar12 = vmovmskps_avx(auVar29);
      if (uVar12 != 0) {
        uVar21 = (ulong)(uVar12 & 0xff);
        auVar28 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        uVar19 = 0;
        uVar14 = 8;
        do {
          lVar16 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
            }
          }
          uVar17 = *(undefined4 *)(uVar13 + 0x20 + lVar16 * 4);
          auVar35._4_4_ = uVar17;
          auVar35._0_4_ = uVar17;
          auVar35._8_4_ = uVar17;
          auVar35._12_4_ = uVar17;
          auVar29 = vsubps_avx(auVar35,auVar65._0_16_);
          auVar36._0_4_ = auVar68._0_4_ * auVar29._0_4_;
          auVar36._4_4_ = auVar68._4_4_ * auVar29._4_4_;
          auVar36._8_4_ = auVar68._8_4_ * auVar29._8_4_;
          auVar36._12_4_ = auVar68._12_4_ * auVar29._12_4_;
          uVar17 = *(undefined4 *)(uVar13 + 0x40 + lVar16 * 4);
          auVar43._4_4_ = uVar17;
          auVar43._0_4_ = uVar17;
          auVar43._8_4_ = uVar17;
          auVar43._12_4_ = uVar17;
          auVar29 = vsubps_avx(auVar43,auVar66._0_16_);
          auVar44._0_4_ = auVar69._0_4_ * auVar29._0_4_;
          auVar44._4_4_ = auVar69._4_4_ * auVar29._4_4_;
          auVar44._8_4_ = auVar69._8_4_ * auVar29._8_4_;
          auVar44._12_4_ = auVar69._12_4_ * auVar29._12_4_;
          uVar17 = *(undefined4 *)(uVar13 + 0x60 + lVar16 * 4);
          auVar49._4_4_ = uVar17;
          auVar49._0_4_ = uVar17;
          auVar49._8_4_ = uVar17;
          auVar49._12_4_ = uVar17;
          auVar29 = vsubps_avx(auVar49,auVar67._0_16_);
          auVar50._0_4_ = auVar64._0_4_ * auVar29._0_4_;
          auVar50._4_4_ = auVar64._4_4_ * auVar29._4_4_;
          auVar50._8_4_ = auVar64._8_4_ * auVar29._8_4_;
          auVar50._12_4_ = auVar64._12_4_ * auVar29._12_4_;
          uVar17 = *(undefined4 *)(uVar13 + 0x30 + lVar16 * 4);
          auVar54._4_4_ = uVar17;
          auVar54._0_4_ = uVar17;
          auVar54._8_4_ = uVar17;
          auVar54._12_4_ = uVar17;
          auVar29 = vsubps_avx(auVar54,auVar65._0_16_);
          auVar55._0_4_ = auVar68._0_4_ * auVar29._0_4_;
          auVar55._4_4_ = auVar68._4_4_ * auVar29._4_4_;
          auVar55._8_4_ = auVar68._8_4_ * auVar29._8_4_;
          auVar55._12_4_ = auVar68._12_4_ * auVar29._12_4_;
          uVar17 = *(undefined4 *)(uVar13 + 0x50 + lVar16 * 4);
          auVar57._4_4_ = uVar17;
          auVar57._0_4_ = uVar17;
          auVar57._8_4_ = uVar17;
          auVar57._12_4_ = uVar17;
          auVar29 = vsubps_avx(auVar57,auVar66._0_16_);
          auVar58._0_4_ = auVar69._0_4_ * auVar29._0_4_;
          auVar58._4_4_ = auVar69._4_4_ * auVar29._4_4_;
          auVar58._8_4_ = auVar69._8_4_ * auVar29._8_4_;
          auVar58._12_4_ = auVar69._12_4_ * auVar29._12_4_;
          uVar17 = *(undefined4 *)(uVar13 + 0x70 + lVar16 * 4);
          auVar60._4_4_ = uVar17;
          auVar60._0_4_ = uVar17;
          auVar60._8_4_ = uVar17;
          auVar60._12_4_ = uVar17;
          auVar29 = vsubps_avx(auVar60,auVar67._0_16_);
          auVar61._0_4_ = auVar64._0_4_ * auVar29._0_4_;
          auVar61._4_4_ = auVar64._4_4_ * auVar29._4_4_;
          auVar61._8_4_ = auVar64._8_4_ * auVar29._8_4_;
          auVar61._12_4_ = auVar64._12_4_ * auVar29._12_4_;
          auVar29 = vpminsd_avx(auVar36,auVar55);
          auVar31 = vpminsd_avx(auVar44,auVar58);
          auVar29 = vpmaxsd_avx(auVar29,auVar31);
          auVar40 = vpminsd_avx(auVar50,auVar61);
          auVar31 = vpmaxsd_avx(auVar36,auVar55);
          auVar56 = ZEXT1664(auVar53);
          auVar38 = vpmaxsd_avx(auVar44,auVar58);
          auVar39 = vpminsd_avx(auVar31,auVar38);
          auVar31 = vpmaxsd_avx(auVar50,auVar61);
          auVar38 = vpmaxsd_avx(auVar40,local_f98);
          auVar29 = vpmaxsd_avx(auVar29,auVar38);
          auVar31 = vpminsd_avx(auVar31,auVar53);
          auVar31 = vpminsd_avx(auVar39,auVar31);
          auVar29 = vcmpps_avx(auVar29,auVar31,2);
          uVar15 = uVar14;
          if ((((auVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar29 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar29[0xf] < '\0') {
            uVar17 = *(undefined4 *)((long)&stack[-1].ptr.ptr + lVar16 * 4);
            auVar37._4_4_ = uVar17;
            auVar37._0_4_ = uVar17;
            auVar37._8_4_ = uVar17;
            auVar37._12_4_ = uVar17;
            uVar15 = *(ulong *)(uVar13 + lVar16 * 8);
            auVar31 = auVar28._0_16_;
            auVar29 = vcmpps_avx(auVar37,auVar31,1);
            if ((((auVar29 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar29 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar29 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar29[0xf]) {
              (pSVar24->ptr).ptr = uVar15;
              uVar15 = uVar14;
            }
            else {
              if (uVar14 == 8) {
                auVar28 = ZEXT1664(auVar37);
                goto LAB_00f1b3e7;
              }
              (pSVar24->ptr).ptr = uVar14;
              auVar28 = ZEXT1664(auVar37);
              auVar37 = auVar31;
            }
            uVar19 = uVar19 + 1;
            pSVar24->dist = auVar37._0_4_;
            pSVar24 = pSVar24 + 1;
          }
LAB_00f1b3e7:
          uVar21 = uVar21 & uVar21 - 1;
          uVar14 = uVar15;
        } while (uVar21 != 0);
        if (uVar15 == 8) goto LAB_00f1b1c9;
        uVar13 = uVar15;
        if (1 < uVar19) {
          pSVar1 = pSVar24 + -2;
          pSVar2 = pSVar24 + -1;
          if (pSVar24[-2].dist < pSVar24[-1].dist) {
            sVar10 = (pSVar1->ptr).ptr;
            uVar11 = *(undefined8 *)&pSVar24[-2].dist;
            pSVar24[-2].dist = pSVar24[-1].dist;
            (pSVar1->ptr).ptr = (pSVar2->ptr).ptr;
            (pSVar2->ptr).ptr = sVar10;
            valid_leaf.field_0.i[2] = (int)uVar11;
            pSVar24[-1].dist = (uint)valid_leaf.field_0.v[2];
          }
          if (uVar19 != 2) {
            pSVar3 = pSVar24 + -3;
            uVar12 = pSVar24[-3].dist;
            if (uVar12 < pSVar24[-1].dist) {
              sVar10 = (pSVar3->ptr).ptr;
              uVar11 = *(undefined8 *)&pSVar24[-3].dist;
              pSVar24[-3].dist = pSVar24[-1].dist;
              (pSVar3->ptr).ptr = (pSVar2->ptr).ptr;
              (pSVar2->ptr).ptr = sVar10;
              valid_leaf.field_0.i[2] = (int)uVar11;
              pSVar24[-1].dist = (uint)valid_leaf.field_0.v[2];
              uVar12 = pSVar24[-3].dist;
            }
            if (uVar12 < pSVar24[-2].dist) {
              sVar10 = (pSVar3->ptr).ptr;
              uVar11 = *(undefined8 *)&pSVar24[-3].dist;
              pSVar24[-3].dist = pSVar24[-2].dist;
              (pSVar3->ptr).ptr = (pSVar1->ptr).ptr;
              (pSVar1->ptr).ptr = sVar10;
              valid_leaf.field_0.i[2] = (int)uVar11;
              pSVar24[-2].dist = (uint)valid_leaf.field_0.v[2];
            }
          }
        }
        goto LAB_00f1b1f3;
      }
      goto LAB_00f1b1c9;
    }
    valid_leaf.field_0 =
         (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)vcmpps_avx(auVar56._0_16_,auVar28._0_16_,6);
    if (((((undefined1  [16])valid_leaf.field_0 >> 0x1f & (undefined1  [16])0x1) ==
          (undefined1  [16])0x0 &&
         ((undefined1  [16])valid_leaf.field_0 >> 0x3f & (undefined1  [16])0x1) ==
         (undefined1  [16])0x0) &&
        ((undefined1  [16])valid_leaf.field_0 >> 0x5f & (undefined1  [16])0x1) ==
        (undefined1  [16])0x0) && -1 < valid_leaf.field_0._15_1_) goto LAB_00f1b59a;
    lVar16 = (ulong)((uint)uVar13 & 0xf) - 8;
    prim = (Primitive_conflict4 *)(uVar13 & 0xfffffffffffffff0);
    while (bVar25 = lVar16 != 0, lVar16 = lVar16 + -1, bVar25) {
      InstanceArrayIntersectorK<4>::intersect(&valid_leaf,&pre,ray,context,prim);
      auVar56 = ZEXT1664(auVar53);
      auVar64 = ZEXT1664(local_10c8);
      auVar69 = ZEXT1664(local_10b8);
      auVar68 = ZEXT1664(local_10a8);
      auVar67 = ZEXT1664(local_1098);
      auVar66 = ZEXT1664(local_1088);
      auVar65 = ZEXT1664(local_1078);
      prim = prim + 1;
    }
    auVar26 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar56._0_16_,1);
    auVar26 = (undefined1  [16])valid_leaf.field_0 & auVar26;
    if ((((auVar26 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar26 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar26 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar26[0xf]) {
LAB_00f1b59a:
      auVar28 = ZEXT1664(auVar27);
    }
    else {
      auVar26 = vblendvps_avx(auVar56._0_16_,*(undefined1 (*) [16])(ray + 0x80),
                              (undefined1  [16])valid_leaf.field_0);
      auVar56 = ZEXT1664(auVar26);
      auVar27 = vshufps_avx(auVar26,auVar26,0xb1);
      auVar26 = vmaxps_avx(auVar27,auVar26);
      auVar27 = vshufpd_avx(auVar26,auVar26,1);
      auVar26 = vmaxss_avx(auVar27,auVar26);
      auVar28 = ZEXT1664(auVar26);
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersectCoherent(vint<K>* __restrict__ valid_i,
                                                                                                       Accel::Intersectors* __restrict__ This,
                                                                                                       RayHitK<K>& __restrict__ ray,
                                                                                                       RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vbool<K> octant_valid = octant[valid_index] == octant;
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        Frustum<robust> frustum;
        frustum.template init<K>(octant_valid, tray.org, tray.rdir, tray.tnear, tray.tfar, N);

        StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;

        while (1) pop:
        {
          /* pop next node from stack */
          if (unlikely(stackPtr == stack)) break;

          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *(float*)&stackPtr->dist;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active))) continue;

          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            //STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const AABBNode* __restrict__ const node = nodeRef.getAABBNode();

            vfloat<N> fmin;
            size_t m_frustum_node = intersectNodeFrustum<N>(node, frustum, fmin);

            if (unlikely(!m_frustum_node)) goto pop;
            cur = BVH::emptyNode;
            curDist = pos_inf;
            
#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[popcnt(m_frustum_node)], 1, 1, 1);
#endif
            size_t num_child_hits = 0;
            do {
              const size_t i = bscf(m_frustum_node);
              vfloat<K> lnearP;
              vbool<K> lhit = false; // motion blur is not supported, so the initial value will be ignored
              STAT3(normal.trav_nodes, 1, 1, 1);
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              if (likely(any(lhit)))
              {                                
                const vfloat<K> childDist = fmin[i];
                const NodeRef child = node->child(i);
                BVHN<N>::prefetch(child);
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    stackPtr->ptr = cur;
                    *(float*)&stackPtr->dist = toScalar(curDist);
                    stackPtr++;
                  }
                  curDist = childDist;
                  cur = child;
                }
                /* push hit child onto stack */
                else {
                  num_child_hits++;
                  stackPtr->ptr = child;
                  *(float*)&stackPtr->dist = toScalar(childDist);
                  stackPtr++;
                }                
              }
            } while(m_frustum_node);

            if (unlikely(cur == BVH::emptyNode)) goto pop;

            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (stackPtr[-2].dist < stackPtr[-1].dist)
                std::swap(stackPtr[-2],stackPtr[-1]);
              if (unlikely(num_child_hits >= 3))
              {
                if (stackPtr[-3].dist < stackPtr[-1].dist)
                  std::swap(stackPtr[-3],stackPtr[-1]);
                if (stackPtr[-3].dist < stackPtr[-2].dist)
                  std::swap(stackPtr[-3],stackPtr[-2]);
              }
            }
          }

          /* intersect leaf */
          assert(cur != BVH::invalidNode);
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);

          /* reduce max distance interval on successful intersection */
          if (likely(any((ray.tfar < tray.tfar) & valid_leaf)))
          {
            tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);
            frustum.template updateMaxDist<K>(tray.tfar);
          }

          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        
      } while(valid_bits);
    }